

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

int Am_Connection::Merge_Mask(fd_set *fds)

{
  int iVar1;
  Am_Connection_Data *pAVar2;
  int iVar3;
  connection_list_class *pcVar4;
  int iVar5;
  
  iVar3 = m_parent_socket + 0x3f;
  if (-1 < m_parent_socket) {
    iVar3 = m_parent_socket;
  }
  fds->fds_bits[iVar3 >> 6] = fds->fds_bits[iVar3 >> 6] | 1L << ((byte)m_parent_socket & 0x3f);
  pcVar4 = connection_list;
  iVar3 = max_socket;
  if (connection_list != (Connection_List_Ptr)0x0 && num_sockets != 0) {
    do {
      pAVar2 = pcVar4->connection_ptr->data;
      if (pAVar2->connected == true) {
        iVar1 = *(int *)&(pAVar2->super_Am_Wrapper).field_0xc;
        iVar5 = iVar1 + 0x3f;
        if (-1 < iVar1) {
          iVar5 = iVar1;
        }
        fds->fds_bits[iVar5 >> 6] = fds->fds_bits[iVar5 >> 6] | 1L << ((byte)iVar1 & 0x3f);
        if (iVar3 < iVar1) {
          iVar3 = iVar1;
          max_socket = iVar1;
        }
      }
      pcVar4 = pcVar4->next;
    } while (pcVar4 != (connection_list_class *)0x0);
  }
  return iVar3 + 1;
}

Assistant:

int
Am_Connection::Merge_Mask(fd_set *fds)
{
  Connection_List_Ptr place_holder;
  FD_SET(m_parent_socket, fds);
  if (num_sockets != 0) {
    place_holder = connection_list;
    while (place_holder != nullptr) {
      ;
      //                     fds) <<std::flush;
      if (place_holder->connection_ptr->Connected()) {
        FD_SET(place_holder->connection_ptr->Get_Socket(), fds);
        if (place_holder->connection_ptr->Get_Socket() > max_socket)
          max_socket = place_holder->connection_ptr->Get_Socket();
      }
      //else
      place_holder = place_holder->next;
    }
  }
  return max_socket + 1;
}